

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

FrameOpResult __thiscall QRhiGles2::endOffscreenFrame(QRhiGles2 *this,EndFrameFlags flags)

{
  bool bVar1;
  long lVar2;
  QSurface *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  quint64 nanoseconds;
  quint64 timestamps [2];
  QRhiCommandBuffer *in_stack_000001c8;
  QRhiGles2 *in_stack_000001d0;
  GLuint in_stack_ffffffffffffffb8;
  Cmd in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QRhiGles2 *in_stack_ffffffffffffffd0;
  FrameOpResult local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&in_RDI[0x1e].m_type = Window;
  addBoundaryCommand((QGles2CommandBuffer *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  bVar1 = ensureContext(in_stack_ffffffffffffffd0,in_RDI);
  if (bVar1) {
    executeCommandBuffer(in_stack_000001d0,in_stack_000001c8);
    QOpenGLFunctions::glFlush((QOpenGLFunctions *)0x92149d);
    if (in_RDI[0x59].m_type != Window) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)&in_RDI[0x14].m_type)(*(undefined4 *)&in_RDI[0x59].field_0xc,0x8866,&local_10);
      (**(code **)&in_RDI[0x14].m_type)(in_RDI[0x59].m_type,0x8866,&local_18);
      if (local_18 <= local_10) {
        lVar2 = (long)local_10 - (long)local_18;
        auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar3._0_8_ = lVar2;
        auVar3._12_4_ = 0x45300000;
        *(double *)&in_RDI[0x28].m_type =
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000000.0;
      }
    }
    local_1c = FrameOpSuccess;
  }
  else {
    local_1c = FrameOpError;
    if (((ulong)in_RDI[0x1d]._vptr_QSurface & 1) != 0) {
      local_1c = FrameOpDeviceLost;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

QRhi::FrameOpResult QRhiGles2::endOffscreenFrame(QRhi::EndFrameFlags flags)
{
    Q_UNUSED(flags);
    Q_ASSERT(ofr.active);
    ofr.active = false;

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::EndFrame, ofr.tsQueries[1]);

    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    executeCommandBuffer(&ofr.cbWrapper);

    // Just as endFrame() does a flush when skipping the swapBuffers(), do it
    // here as well. This has the added benefit of playing nice when rendering
    // to a texture from a context and then consuming that texture from
    // another, sharing context.
    f->glFlush();

    if (ofr.tsQueries[0]) {
        quint64 timestamps[2];
        glGetQueryObjectui64v(ofr.tsQueries[1], GL_QUERY_RESULT, &timestamps[1]);
        glGetQueryObjectui64v(ofr.tsQueries[0], GL_QUERY_RESULT, &timestamps[0]);
        if (timestamps[1] >= timestamps[0]) {
            const quint64 nanoseconds = timestamps[1] - timestamps[0];
            ofr.cbWrapper.lastGpuTime = nanoseconds / 1000000000.0; // seconds
        }
    }

    return QRhi::FrameOpSuccess;
}